

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O1

cellid_t __thiscall trimesh::dataset_t::max_vert<_1>(dataset_t *this,cellid_t c)

{
  tri_cc_t *this_00;
  uint uVar1;
  cellid_t *pcVar2;
  ostream *poVar3;
  runtime_error *this_01;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  this_00 = (this->m_tcc).px;
  if (this_00 == (tri_cc_t *)0x0) {
    __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<tri_cc_t>::operator->() const [T = tri_cc_t]"
                 );
  }
  uVar1 = tri_cc_t::get_cell_dim(this_00,c);
  if (uVar1 != 0) {
    if (uVar1 != 1) {
      if (uVar1 != 2) {
        std::__cxx11::stringstream::stringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"Failed to assert condition ",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"false&&\"invalid celldim\"",0x18);
        std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(local_190,"at (",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>(local_190,",",1);
        std::__ostream_insert<char,std::char_traits<char>>(local_190,"max_vert",8);
        std::__ostream_insert<char,std::char_traits<char>>(local_190,",",1);
        poVar3 = (ostream *)std::ostream::operator<<(local_190,0x3e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") \n ",4);
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_01,local_1c0);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar2 = max_fct(this,c);
      c = *pcVar2;
    }
    pcVar2 = max_fct(this,c);
    c = *pcVar2;
  }
  return c;
}

Assistant:

inline cellid_t dataset_t::max_vert<-1>(cellid_t c) const
  {
    switch(cell_dim(c))
    {
      case 2: c = max_fct(c);//break;
      case 1: c = max_fct(c);//break;
      case 0: return c;
    }
    ASSERT(false&&"invalid celldim");
    return c;
  }